

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t archive_read_format_lha_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  int64_t *piVar1;
  wchar_t local_3c;
  wchar_t r;
  lha *lha;
  int64_t *offset_local;
  size_t *size_local;
  void **buff_local;
  archive_read *a_local;
  
  piVar1 = (int64_t *)a->format->data;
  if (piVar1[2] != 0) {
    __archive_read_consume(a,piVar1[2]);
    piVar1[2] = 0;
  }
  if (*(char *)((long)piVar1 + 0x124) == '\0') {
    if (*(char *)((long)piVar1 + 0x126) == '\0') {
      local_3c = lha_read_data_none(a,buff,size,offset);
    }
    else {
      local_3c = lha_read_data_lzh(a,buff,size,offset);
    }
    a_local._4_4_ = local_3c;
  }
  else {
    *offset = *piVar1;
    *size = 0;
    *buff = (void *)0x0;
    a_local._4_4_ = lha_end_of_entry(a);
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_lha_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	struct lha *lha = (struct lha *)(a->format->data);
	int r;

	if (lha->entry_unconsumed) {
		/* Consume as much as the decompressor actually used. */
		__archive_read_consume(a, lha->entry_unconsumed);
		lha->entry_unconsumed = 0;
	}
	if (lha->end_of_entry) {
		*offset = lha->entry_offset;
		*size = 0;
		*buff = NULL;
		return (lha_end_of_entry(a));
	}

	if (lha->entry_is_compressed)
		r =  lha_read_data_lzh(a, buff, size, offset);
	else
		/* No compression. */
		r =  lha_read_data_none(a, buff, size, offset);
	return (r);
}